

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInIndexByHandle
              (void *handle,void *tx_data_handle,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  string *message;
  uint32_t in_ECX;
  CfdException *in_RDX;
  long in_RSI;
  undefined4 *in_R8;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  OutPoint outpoint;
  CfdCapiTransactionData *tx_data;
  string *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe60;
  bool *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  allocator local_141;
  string local_140 [38];
  byte local_11a;
  allocator local_119;
  string local_118;
  Txid local_f8;
  undefined1 local_d8 [32];
  string *in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [48];
  undefined4 *local_30;
  uint32_t local_24;
  CfdException *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TransactionData",&local_61);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xfbb;
    local_80.funcname = "CfdGetTxInIndexByHandle";
    cfd::core::logger::warn<>(&local_80,"txid is null or empty.");
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. txid is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe60,error_code,in_stack_fffffffffffffe50);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,(char *)local_20,&local_119);
  cfd::core::Txid::Txid(&local_f8,&local_118);
  cfd::core::OutPoint::OutPoint((OutPoint *)local_d8,&local_f8,local_24);
  cfd::core::Txid::~Txid((Txid *)0x661ee6);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_11a = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffea4,in_stack_fffffffffffffe98);
  if (*(long *)(local_18 + 0x18) != 0) {
    if ((local_11a & 1) == 0) {
      if (local_30 != (undefined4 *)0x0) {
        uVar2 = (**(code **)(**(long **)(local_18 + 0x18) + 0x78))
                          (*(long **)(local_18 + 0x18),local_d8);
        *local_30 = uVar2;
      }
    }
    else if (local_30 != (undefined4 *)0x0) {
      uVar2 = (**(code **)(**(long **)(local_18 + 0x18) + 0x78))
                        (*(long **)(local_18 + 0x18),local_d8);
      *local_30 = uVar2;
    }
    local_4 = 0;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x66214f);
    return local_4;
  }
  message = (string *)__cxa_allocate_exception(0x30);
  paVar4 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"Invalid handle state. tx is null",paVar4);
  cfd::core::CfdException::CfdException(local_20,(CfdError)((ulong)paVar4 >> 0x20),message);
  __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIndexByHandle(
    void* handle, void* tx_data_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    OutPoint outpoint(Txid(txid), vout);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}